

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float32_to_float16_ppc(float32 a,_Bool ieee,float_status *s)

{
  float16 fVar1;
  FloatFmt *dstf;
  FloatParts FVar2;
  FloatParts pr;
  FloatParts p;
  FloatFmt *fmt16;
  float_status *s_local;
  _Bool ieee_local;
  float32 a_local;
  
  dstf = &float16_params_ahp;
  if (ieee) {
    dstf = &float16_params;
  }
  FVar2 = float32_unpack_canonical(a,s);
  FVar2 = float_to_float(FVar2,dstf,s);
  fVar1 = float16a_round_pack_canonical(FVar2,s,dstf);
  return fVar1;
}

Assistant:

float16 float32_to_float16(float32 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float32_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, fmt16, s);
    return float16a_round_pack_canonical(pr, s, fmt16);
}